

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBox::~QComboBox(QComboBox *this)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  int in_ESI;
  int *piVar4;
  long lVar5;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007efdf0;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QComboBox_007effc0;
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  lVar5 = 0;
  do {
    QObject::disconnect((Connection *)(lVar2 + 600 + lVar5));
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x40);
  if (((*(long *)(lVar2 + 0x2a8) != 0) && (*(int *)(*(long *)(lVar2 + 0x2a8) + 4) != 0)) &&
     (*(QWidget **)(lVar2 + 0x2b0) != (QWidget *)0x0)) {
    puVar1 = (undefined8 *)(lVar2 + 0x2a8);
    QWidget::close(*(QWidget **)(lVar2 + 0x2b0),in_ESI);
    piVar4 = (int *)*puVar1;
    if (piVar4 == (int *)0x0) {
      *puVar1 = 0;
      *(undefined8 *)(lVar2 + 0x2b0) = 0;
    }
    else {
      if ((piVar4[1] == 0) || (plVar3 = *(long **)(lVar2 + 0x2b0), plVar3 == (long *)0x0)) {
        *puVar1 = 0;
        *(undefined8 *)(lVar2 + 0x2b0) = 0;
      }
      else {
        (**(code **)(*plVar3 + 0x20))(plVar3);
        piVar4 = (int *)*puVar1;
        *puVar1 = 0;
        *(undefined8 *)(lVar2 + 0x2b0) = 0;
        if (piVar4 == (int *)0x0) goto LAB_003d8691;
      }
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        operator_delete(piVar4);
      }
    }
  }
LAB_003d8691:
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QComboBox::~QComboBox()
{
    // ### check delegateparent and delete delegate if us?
    Q_D(QComboBox);

    QT_TRY {
        d->disconnectModel();
    }